

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_relation.cpp
# Opt level: O2

void __thiscall duckdb::TableRelation::Delete(TableRelation *this,string *condition)

{
  shared_ptr<duckdb::ClientContextWrapper,_true> *this_00;
  type context;
  pointer args_3;
  pointer pTVar1;
  unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true> *this_01
  ;
  shared_ptr<duckdb::DeleteRelation,_true> del;
  undefined1 local_40 [8];
  undefined1 local_38 [24];
  
  this_00 = &(this->super_Relation).context;
  shared_ptr<duckdb::ClientContextWrapper,_true>::operator->(this_00);
  ClientContextWrapper::GetContext((ClientContextWrapper *)local_38);
  context = shared_ptr<duckdb::ClientContext,_true>::operator*
                      ((shared_ptr<duckdb::ClientContext,_true> *)local_38);
  ParseCondition((duckdb *)local_40,context,condition);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  this_01 = &this->description;
  args_3 = unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
           ::operator->(this_01);
  pTVar1 = unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
           ::operator->(this_01);
  unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>::
  operator->(this_01);
  make_shared_ptr<duckdb::DeleteRelation,duckdb::shared_ptr<duckdb::ClientContextWrapper,true>&,duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string&>
            ((shared_ptr<duckdb::ClientContextWrapper,_true> *)local_38,
             (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
              *)this_00,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
             &args_3->database,&pTVar1->schema);
  shared_ptr<duckdb::DeleteRelation,_true>::operator->
            ((shared_ptr<duckdb::DeleteRelation,_true> *)local_38);
  Relation::Execute((Relation *)(local_38 + 0x10));
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38._16_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    (**(code **)(*(long *)local_38._16_8_ + 8))();
  }
  local_38._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_38 + 8));
  if (local_40 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_40 + 8))();
  }
  return;
}

Assistant:

void TableRelation::Delete(const string &condition) {
	auto cond = ParseCondition(*context->GetContext(), condition);
	auto del = make_shared_ptr<DeleteRelation>(context, std::move(cond), description->database, description->schema,
	                                           description->table);
	del->Execute();
}